

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall QtMWidgets::RowsSeparator::paintEvent(RowsSeparator *this,QPaintEvent *param_1)

{
  int x2;
  QPalette *this_00;
  QPainter local_20 [8];
  QPainter p;
  QPaintEvent *param_1_local;
  RowsSeparator *this_local;
  
  _p = param_1;
  QPainter::QPainter(local_20,(QPaintDevice *)&this->field_0x10);
  this_00 = (QPalette *)QWidget::palette();
  QPalette::color(this_00,Midlight);
  QPainter::setPen((QColor *)local_20);
  x2 = QWidget::width(&this->super_QWidget);
  QPainter::drawLine(local_20,0xb,0,x2,0);
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void paintEvent( QPaintEvent * ) override
	{
		QPainter p( this );

		p.setPen( palette().color( QPalette::Midlight ) );
		p.drawLine( 11, 0, width(), 0 );
	}